

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

bool duckdb::ParsedExpressionIsAggregate(Binder *binder,ParsedExpression *expr)

{
  FunctionExpression *pFVar1;
  CatalogEntry *pCVar2;
  bool is_aggregate;
  EntryLookupInfo lookup_info;
  
  if ((expr->super_BaseExpression).expression_class == FUNCTION) {
    pFVar1 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
    EntryLookupInfo::EntryLookupInfo
              (&lookup_info,AGGREGATE_FUNCTION_ENTRY,&pFVar1->function_name,
               (QueryErrorContext)0xffffffffffffffff);
    _is_aggregate =
         CatalogEntryRetriever::GetEntry
                   (&binder->entry_retriever,&pFVar1->catalog,&pFVar1->schema,&lookup_info,
                    RETURN_NULL);
    if ((_is_aggregate != (CatalogEntry *)0x0) &&
       (pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                           ((optional_ptr<duckdb::CatalogEntry,_true> *)&is_aggregate),
       pCVar2->type == AGGREGATE_FUNCTION_ENTRY)) {
      return true;
    }
  }
  _is_aggregate = _is_aggregate & 0xffffffffffffff00;
  lookup_info.error_context.query_location.index =
       (optional_idx)
       ::std::
       _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:251:12)>
       ::_M_invoke;
  lookup_info.at_clause.ptr =
       (BoundAtClause *)
       ::std::
       _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder.cpp:251:12)>
       ::_M_manager;
  lookup_info._0_8_ = &is_aggregate;
  lookup_info.name = (string *)binder;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(const_duckdb::ParsedExpression_&)> *)&lookup_info);
  ::std::_Function_base::~_Function_base((_Function_base *)&lookup_info);
  return is_aggregate;
}

Assistant:

static bool ParsedExpressionIsAggregate(Binder &binder, const ParsedExpression &expr) {
	if (expr.GetExpressionClass() == ExpressionClass::FUNCTION) {
		auto &function = expr.Cast<FunctionExpression>();
		QueryErrorContext error_context;

		EntryLookupInfo lookup_info(CatalogType::AGGREGATE_FUNCTION_ENTRY, function.function_name, error_context);
		auto entry =
		    binder.GetCatalogEntry(function.catalog, function.schema, lookup_info, OnEntryNotFound::RETURN_NULL);
		if (entry && entry->type == CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			return true;
		}
	}
	bool is_aggregate = false;
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { is_aggregate |= ParsedExpressionIsAggregate(binder, child); });
	return is_aggregate;
}